

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O1

void qt_rectfill_fp32x4(QRasterBuffer *rasterBuffer,int x,int y,int width,int height,QRgba64 *color)

{
  ulong uVar1;
  uchar *puVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  uchar *puVar6;
  long in_FS_OFFSET;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = 0xffffffff;
  uStack_44 = 0xffffffff;
  uStack_40 = 0xffffffff;
  uStack_3c = 0xffffffff;
  (*qStoreFromRGBA64PM[rasterBuffer->format])
            ((uchar *)&local_48,color,0,1,(QList<unsigned_int> *)0x0,(QDitherInfo *)0x0);
  uVar1 = rasterBuffer->bytes_per_line;
  puVar2 = rasterBuffer->m_buffer + (long)y * uVar1 + (long)x * 0x10;
  lVar5 = (long)width;
  if ((uVar1 & 0xffffffff) == lVar5 << 4) {
    lVar5 = height * lVar5;
    if (lVar5 != 0) {
      lVar3 = lVar5 + 0xe;
      if (-1 < lVar5 + 7) {
        lVar3 = lVar5 + 7;
      }
      lVar3 = lVar3 >> 3;
      lVar4 = lVar3;
      switch((uint)lVar5 & 7) {
      case 0:
        do {
          *(undefined4 *)puVar2 = local_48;
          *(undefined4 *)(puVar2 + 4) = uStack_44;
          *(undefined4 *)(puVar2 + 8) = uStack_40;
          *(undefined4 *)(puVar2 + 0xc) = uStack_3c;
          puVar2 = puVar2 + 0x10;
switchD_006657e0_caseD_7:
          *(undefined4 *)puVar2 = local_48;
          *(undefined4 *)(puVar2 + 4) = uStack_44;
          *(undefined4 *)(puVar2 + 8) = uStack_40;
          *(undefined4 *)(puVar2 + 0xc) = uStack_3c;
          puVar2 = puVar2 + 0x10;
switchD_006657e0_caseD_6:
          *(undefined4 *)puVar2 = local_48;
          *(undefined4 *)(puVar2 + 4) = uStack_44;
          *(undefined4 *)(puVar2 + 8) = uStack_40;
          *(undefined4 *)(puVar2 + 0xc) = uStack_3c;
          puVar2 = puVar2 + 0x10;
switchD_006657e0_caseD_5:
          *(undefined4 *)puVar2 = local_48;
          *(undefined4 *)(puVar2 + 4) = uStack_44;
          *(undefined4 *)(puVar2 + 8) = uStack_40;
          *(undefined4 *)(puVar2 + 0xc) = uStack_3c;
          puVar2 = puVar2 + 0x10;
switchD_006657e0_caseD_4:
          *(undefined4 *)puVar2 = local_48;
          *(undefined4 *)(puVar2 + 4) = uStack_44;
          *(undefined4 *)(puVar2 + 8) = uStack_40;
          *(undefined4 *)(puVar2 + 0xc) = uStack_3c;
          puVar2 = puVar2 + 0x10;
switchD_006657e0_caseD_3:
          *(undefined4 *)puVar2 = local_48;
          *(undefined4 *)(puVar2 + 4) = uStack_44;
          *(undefined4 *)(puVar2 + 8) = uStack_40;
          *(undefined4 *)(puVar2 + 0xc) = uStack_3c;
          puVar2 = puVar2 + 0x10;
switchD_006657e0_caseD_2:
          *(undefined4 *)puVar2 = local_48;
          *(undefined4 *)(puVar2 + 4) = uStack_44;
          *(undefined4 *)(puVar2 + 8) = uStack_40;
          *(undefined4 *)(puVar2 + 0xc) = uStack_3c;
          puVar2 = puVar2 + 0x10;
          lVar4 = lVar3;
switchD_006657e0_caseD_1:
          *(undefined4 *)puVar2 = local_48;
          *(undefined4 *)(puVar2 + 4) = uStack_44;
          *(undefined4 *)(puVar2 + 8) = uStack_40;
          *(undefined4 *)(puVar2 + 0xc) = uStack_3c;
          puVar2 = puVar2 + 0x10;
          lVar3 = lVar4 + -1;
        } while (1 < lVar4);
        break;
      case 1:
        goto switchD_006657e0_caseD_1;
      case 2:
        goto switchD_006657e0_caseD_2;
      case 3:
        goto switchD_006657e0_caseD_3;
      case 4:
        goto switchD_006657e0_caseD_4;
      case 5:
        goto switchD_006657e0_caseD_5;
      case 6:
        goto switchD_006657e0_caseD_6;
      case 7:
        goto switchD_006657e0_caseD_7;
      }
    }
  }
  else if (0 < height) {
    lVar3 = lVar5 + 0xe;
    if (-1 < lVar5 + 7) {
      lVar3 = lVar5 + 7;
    }
    lVar3 = lVar3 >> 3;
    do {
      if (width != 0) {
        lVar5 = lVar3;
        switch(width & 7) {
        case 0:
          puVar6 = puVar2;
          break;
        case 1:
          puVar6 = puVar2;
          lVar4 = lVar3;
          goto LAB_0066589b;
        case 2:
          puVar6 = puVar2;
          goto LAB_00665890;
        case 3:
          puVar6 = puVar2;
          goto LAB_00665888;
        case 4:
          puVar6 = puVar2;
          goto LAB_00665880;
        case 5:
          puVar6 = puVar2;
          goto LAB_00665878;
        case 6:
          puVar6 = puVar2;
          goto LAB_00665870;
        case 7:
          puVar6 = puVar2;
          goto LAB_00665868;
        }
        do {
          *(undefined4 *)puVar6 = local_48;
          *(undefined4 *)(puVar6 + 4) = uStack_44;
          *(undefined4 *)(puVar6 + 8) = uStack_40;
          *(undefined4 *)(puVar6 + 0xc) = uStack_3c;
          puVar6 = puVar6 + 0x10;
LAB_00665868:
          *(undefined4 *)puVar6 = local_48;
          *(undefined4 *)(puVar6 + 4) = uStack_44;
          *(undefined4 *)(puVar6 + 8) = uStack_40;
          *(undefined4 *)(puVar6 + 0xc) = uStack_3c;
          puVar6 = puVar6 + 0x10;
LAB_00665870:
          *(undefined4 *)puVar6 = local_48;
          *(undefined4 *)(puVar6 + 4) = uStack_44;
          *(undefined4 *)(puVar6 + 8) = uStack_40;
          *(undefined4 *)(puVar6 + 0xc) = uStack_3c;
          puVar6 = puVar6 + 0x10;
LAB_00665878:
          *(undefined4 *)puVar6 = local_48;
          *(undefined4 *)(puVar6 + 4) = uStack_44;
          *(undefined4 *)(puVar6 + 8) = uStack_40;
          *(undefined4 *)(puVar6 + 0xc) = uStack_3c;
          puVar6 = puVar6 + 0x10;
LAB_00665880:
          *(undefined4 *)puVar6 = local_48;
          *(undefined4 *)(puVar6 + 4) = uStack_44;
          *(undefined4 *)(puVar6 + 8) = uStack_40;
          *(undefined4 *)(puVar6 + 0xc) = uStack_3c;
          puVar6 = puVar6 + 0x10;
LAB_00665888:
          *(undefined4 *)puVar6 = local_48;
          *(undefined4 *)(puVar6 + 4) = uStack_44;
          *(undefined4 *)(puVar6 + 8) = uStack_40;
          *(undefined4 *)(puVar6 + 0xc) = uStack_3c;
          puVar6 = puVar6 + 0x10;
LAB_00665890:
          *(undefined4 *)puVar6 = local_48;
          *(undefined4 *)(puVar6 + 4) = uStack_44;
          *(undefined4 *)(puVar6 + 8) = uStack_40;
          *(undefined4 *)(puVar6 + 0xc) = uStack_3c;
          puVar6 = puVar6 + 0x10;
          lVar4 = lVar5;
LAB_0066589b:
          *(undefined4 *)puVar6 = local_48;
          *(undefined4 *)(puVar6 + 4) = uStack_44;
          *(undefined4 *)(puVar6 + 8) = uStack_40;
          *(undefined4 *)(puVar6 + 0xc) = uStack_3c;
          puVar6 = puVar6 + 0x10;
          lVar5 = lVar4 + -1;
        } while (1 < lVar4);
      }
      puVar2 = puVar2 + uVar1;
      height = height + -1;
    } while (height != 0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void qt_rectfill_fp32x4(QRasterBuffer *rasterBuffer,
                               int x, int y, int width, int height,
                               const QRgba64 &color)
{
    const auto store = qStoreFromRGBA64PM[rasterBuffer->format];
    QRgbaFloat32 c;
    store(reinterpret_cast<uchar *>(&c), &color, 0, 1, nullptr, nullptr);
    qt_rectfill<QRgbaFloat32>(reinterpret_cast<QRgbaFloat32 *>(rasterBuffer->buffer()),
                          c, x, y, width, height, rasterBuffer->bytesPerLine());
}